

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O2

addr_type __thiscall
DelayImpEntryWrapper::containsAddrType(DelayImpEntryWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  addr_type aVar2;
  undefined4 extraout_var;
  undefined8 uStack_18;
  bool isOk;
  
  aVar2 = NOT_ADDR;
  if (fieldId - 1 < 6) {
    uStack_18 = 0;
    iVar1 = (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                      (this,fieldId,0xffffffffffffffff,&isOk);
    aVar2 = NOT_ADDR;
    if (isOk == true) {
      aVar2 = Executable::detectAddrType
                        ((this->super_ImportBaseEntryWrapper).super_PENodeWrapper.
                         super_ExeNodeWrapper.super_ExeElementWrapper.m_Exe,
                         CONCAT44(extraout_var,iVar1),RVA);
    }
  }
  return aVar2;
}

Assistant:

Executable::addr_type DelayImpEntryWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case NAME :
        case MOD :
        case IAT :
        case INT :
        case BOUND_IAT :
        case UNLOAD_IAT :
        {
            bool isOk = false;
            uint64_t offset = this->getNumValue(fieldId, &isOk);
            if (!isOk) return Executable::NOT_ADDR;

            return m_Exe->detectAddrType(offset, Executable::RVA);
        }
    }
    return Executable::NOT_ADDR;
}